

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_simplex.h
# Opt level: O0

void __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
          (Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
           *this,Vertex_handle args,Vertex_handle args_1)

{
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
  *this_local;
  Vertex_handle args_local_1;
  Vertex_handle args_local;
  
  std::
  set<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  ::set(&this->simplex_set);
  add_vertices<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
            (this,args,args_1);
  return;
}

Assistant:

explicit Skeleton_blocker_simplex(Args ... args) {
    add_vertices(args...);
  }